

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::Cord::PrependArray(Cord *this,string_view src,MethodIdentifier method)

{
  ulong uVar1;
  CordRep *pCVar2;
  byte bVar3;
  Nullable<CordRep_*> tree;
  size_t alloc_hint;
  size_t extraout_RDX;
  size_t length;
  bool bVar4;
  InlineData data;
  undefined8 local_48;
  CordRep *pCStack_40;
  
  length = src._M_len;
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  bVar4 = (bVar3 & 1) == 0;
  pCVar2 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  alloc_hint = CONCAT71(src._M_str._1_7_,pCVar2 == (CordRep *)0x0 || bVar4);
  if ((pCVar2 != (CordRep *)0x0 && !bVar4) && (pCVar2->length == 0)) {
    PrependArray();
    bVar3 = 0;
    alloc_hint = extraout_RDX;
  }
  if (length == 0) {
    return;
  }
  if ((bVar3 & 1) == 0) {
    uVar1 = ((ulong)(long)(char)bVar3 >> 1) + length;
    if (uVar1 < 0x10) {
      pCStack_40 = (CordRep *)0x0;
      local_48 = (ulong)(byte)((char)uVar1 * '\x02');
      memcpy((void *)((long)&local_48 + 1),src._M_str,length);
      memcpy((void *)((long)&local_48 + length + 1),
             (void *)((long)&(this->contents_).data_.rep_.field_0 + 1),(ulong)(long)(char)bVar3 >> 1
            );
      *(ulong *)&(this->contents_).data_.rep_.field_0 = local_48;
      (this->contents_).data_.rep_.field_0.as_tree.rep = pCStack_40;
      return;
    }
  }
  tree = NewTree(src._M_str,length,alloc_hint);
  InlineRep::PrependTree(&this->contents_,tree,method);
  return;
}

Assistant:

void Cord::PrependArray(absl::string_view src, MethodIdentifier method) {
  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;  // memcpy(_, nullptr, 0) is undefined.

  if (!contents_.is_tree()) {
    size_t cur_size = contents_.inline_size();
    if (cur_size + src.size() <= InlineRep::kMaxInline) {
      // Use embedded storage.
      InlineData data;
      data.set_inline_size(cur_size + src.size());
      memcpy(data.as_chars(), src.data(), src.size());
      memcpy(data.as_chars() + src.size(), contents_.data(), cur_size);
      contents_.data_ = data;
      return;
    }
  }
  CordRep* rep = NewTree(src.data(), src.size(), 0);
  contents_.PrependTree(rep, method);
}